

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O3

double double_conversion::RadixStringToIeee<4,unsigned_short_const*>
                 (unsigned_short **current,unsigned_short *end,bool sign,uc16 separator,
                 bool parse_as_hex_float,bool allow_trailing_junk,double junk_string_value,
                 bool read_as_double,bool *result_is_junk)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  undefined7 extraout_var;
  ushort *puVar5;
  double dVar6;
  byte bVar7;
  ushort uVar8;
  ulong uVar9;
  unsigned_short **end_00;
  uint uVar10;
  uint uVar11;
  undefined7 in_register_00000011;
  undefined2 *extraout_RDX;
  undefined2 *extraout_RDX_00;
  undefined2 *extraout_RDX_01;
  undefined2 *puVar12;
  undefined2 *extraout_RDX_02;
  byte bVar13;
  undefined4 uVar14;
  ulong uVar15;
  long lVar16;
  undefined3 in_register_00000089;
  uint uVar17;
  int iVar18;
  Double *this;
  DiyFp diy_fp;
  unsigned_short *local_78;
  undefined4 local_70;
  undefined4 local_6c;
  ushort *local_68;
  ulong local_60;
  double local_58;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  local_6c = CONCAT31(in_register_00000089,allow_trailing_junk);
  *result_is_junk = true;
  local_78 = end;
  local_68 = end;
  local_58 = junk_string_value;
  do {
    puVar5 = *current;
    uVar8 = *puVar5;
    if (uVar8 != 0x30) {
      local_70 = (undefined4)CONCAT71(in_register_00000011,sign);
      uVar15 = 0x18;
      if (read_as_double) {
        uVar15 = 0x35;
      }
      local_60 = 0;
      uVar17 = 0;
      this = (Double *)0x0;
      goto LAB_00493769;
    }
    bVar3 = Advance<unsigned_short_const*>(current,separator,0x10,&local_78);
  } while (!bVar3);
  *result_is_junk = false;
  if (sign) {
LAB_00493aef:
    dVar6 = -0.0;
  }
  else {
    dVar6 = 0.0;
  }
  return dVar6;
LAB_00493769:
  uVar10 = uVar8 - 0x30;
  if (9 < uVar10) {
    if ((ushort)(uVar8 - 0x61) < 6) {
      uVar10 = uVar8 - 0x57;
      goto LAB_00493790;
    }
    puVar12 = (undefined2 *)(ulong)(uVar8 - 0x41);
    uVar10 = (uint)uVar8;
    if ((ushort)(uVar8 - 0x41) < 6) {
      uVar10 = uVar10 - 0x37;
      goto LAB_00493790;
    }
    if (!parse_as_hex_float) {
LAB_00493b06:
      if (puVar5 != local_68 && (char)local_6c == '\0') {
        puVar12 = &kWhitespaceTable16;
        do {
          uVar8 = *puVar5;
          lVar16 = 0;
          if (uVar8 < 0x80) {
            while ((int)(char)(&kWhitespaceTable7)[lVar16] != (uint)uVar8) {
              lVar16 = lVar16 + 1;
              if (lVar16 == 6) {
                return local_58;
              }
            }
          }
          else {
            while (*(ushort *)((long)&kWhitespaceTable16 + lVar16) != uVar8) {
              lVar16 = lVar16 + 2;
              if (lVar16 == 0x28) {
                return local_58;
              }
            }
          }
          puVar5 = puVar5 + 1;
          *current = puVar5;
        } while (puVar5 != local_68);
      }
      goto LAB_004939f2;
    }
    if (uVar10 != 0x2e) {
      if ((uVar10 != 0x50) && (uVar10 != 0x70)) goto LAB_00493b06;
      *result_is_junk = false;
      goto LAB_00493a0b;
    }
    Advance<unsigned_short_const*>(current,separator,0x10,&local_78);
    local_60 = CONCAT71(extraout_var,1);
LAB_004937d2:
    puVar5 = *current;
    uVar8 = *puVar5;
    goto LAB_00493769;
  }
LAB_00493790:
  uVar11 = uVar17 - 4;
  if ((local_60 & 1) == 0) {
    uVar11 = uVar17;
  }
  this = (Double *)((ulong)uVar10 + (long)this * 0x10);
  uVar4 = (long)this >> (sbyte)uVar15;
  if ((int)uVar4 == 0) {
    bVar3 = Advance<unsigned_short_const*>(current,separator,0x10,&local_78);
    puVar12 = extraout_RDX;
    uVar17 = uVar11;
    if (!bVar3) goto LAB_004937d2;
    goto LAB_004939f2;
  }
  iVar18 = 1;
  if (1 < (int)uVar4) {
    uVar9 = uVar4 & 0xffffffff;
    do {
      iVar18 = iVar18 + 1;
      uVar9 = uVar9 >> 1;
      uVar17 = (uint)uVar4;
      uVar4 = uVar9;
    } while (3 < uVar17);
  }
  bVar7 = (byte)iVar18;
  local_44 = -1 << (bVar7 & 0x1f);
  local_40 = (long)this >> (bVar7 & 0x3f);
  local_38 = uVar15;
  bVar3 = Advance<unsigned_short_const*>(current,separator,0x10,&local_78);
  bVar13 = 1;
  iVar18 = uVar11 + iVar18;
  puVar12 = extraout_RDX_00;
  while (!bVar3) {
    puVar5 = *current;
    if (parse_as_hex_float) {
      uVar8 = *puVar5;
      if (uVar8 == 0x2e) {
        end_00 = &local_78;
        Advance<unsigned_short_const*>(current,separator,0x10,end_00);
        puVar5 = *current;
        local_60 = CONCAT71((int7)((ulong)end_00 >> 8),1);
        goto LAB_004938ac;
      }
    }
    else {
LAB_004938ac:
      uVar8 = *puVar5;
    }
    uVar17 = uVar8 - 0x30;
    puVar12 = (undefined2 *)(ulong)CONCAT31((int3)(uVar17 >> 8),uVar17 < 10);
    if ((0x3f < uVar8 || uVar17 >= 10) &&
       ((0x25 < uVar8 - 0x41 ||
        (puVar12 = (undefined2 *)0x3f0000003f,
        (0x3f0000003fU >> ((ulong)(uVar8 - 0x41) & 0x3f) & 1) == 0)))) break;
    bVar13 = bVar13 & uVar8 == 0x30;
    iVar1 = iVar18 + 4;
    if ((local_60 & 1) != 0) {
      iVar1 = iVar18;
    }
    bVar3 = Advance<unsigned_short_const*>(current,separator,0x10,&local_78);
    iVar18 = iVar1;
    puVar12 = extraout_RDX_01;
  }
  if (((char)local_6c == '\0' && !parse_as_hex_float) && (puVar5 = *current, puVar5 != local_68)) {
    puVar12 = &kWhitespaceTable16;
    do {
      uVar8 = *puVar5;
      lVar16 = 0;
      if (uVar8 < 0x80) {
        while ((int)(char)(&kWhitespaceTable7)[lVar16] != (uint)uVar8) {
          lVar16 = lVar16 + 1;
          if (lVar16 == 6) {
            return local_58;
          }
        }
      }
      else {
        while (*(ushort *)((long)&kWhitespaceTable16 + lVar16) != uVar8) {
          lVar16 = lVar16 + 2;
          if (lVar16 == 0x28) {
            return local_58;
          }
        }
      }
      puVar5 = puVar5 + 1;
      *current = puVar5;
    } while (puVar5 != local_68);
  }
  uVar10 = (uint)this & ~local_44;
  uVar17 = 1 << (bVar7 - 1 & 0x1f);
  if ((int)uVar17 < (int)uVar10) {
    uVar15 = local_40 + 1;
  }
  else {
    uVar15 = local_40;
    if (uVar10 == uVar17) {
      uVar15 = local_40 + ((byte)(~bVar13 | (byte)local_40) & 1);
    }
  }
  bVar3 = (uVar15 >> (local_38 & 0x3f) & 1) != 0;
  this = (Double *)((long)uVar15 >> bVar3);
  uVar17 = iVar18 + (uint)bVar3;
LAB_004939f2:
  *result_is_junk = false;
  if (parse_as_hex_float) {
LAB_00493a0b:
    Advance<unsigned_short_const*>(current,separator,0x10,&local_78);
    uVar14 = 0;
    if (**current == 0x2b) {
LAB_00493a35:
      Advance<unsigned_short_const*>(current,separator,0x10,&local_78);
    }
    else if (**current == 0x2d) {
      uVar14 = 1;
      goto LAB_00493a35;
    }
    local_58 = (double)CONCAT44(local_58._4_4_,uVar14);
    uVar10 = 0;
    do {
      uVar11 = **current - 0x30;
      puVar12 = (undefined2 *)(ulong)uVar11;
      if (9 < uVar11) break;
      uVar11 = -uVar10;
      if (0 < (int)uVar10) {
        uVar11 = uVar10;
      }
      uVar2 = (**current - 0x30) + uVar10 * 10;
      if (0x17bb0 < uVar11) {
        uVar2 = uVar10;
      }
      uVar10 = uVar2;
      bVar3 = Advance<unsigned_short_const*>(current,separator,0x10,&local_78);
      puVar12 = extraout_RDX_02;
    } while (!bVar3);
    uVar11 = -uVar10;
    if (local_58._0_1_ == '\0') {
      uVar11 = uVar10;
    }
    uVar17 = uVar11 + uVar17;
  }
  if ((uVar17 != 0) && (this != (Double *)0x0)) {
    diy_fp.f_ = (ulong)uVar17;
    diy_fp._8_8_ = puVar12;
    dVar6 = (double)Double::DiyFpToUint64(this,diy_fp);
    if ((char)local_70 == '\0') {
      return dVar6;
    }
    return (double)((ulong)dVar6 ^ (ulong)DAT_02f96b10);
  }
  if ((char)local_70 == '\0') {
LAB_00493ae5:
    return (double)(long)this;
  }
  if (this != (Double *)0x0) {
    this = (Double *)-(long)this;
    goto LAB_00493ae5;
  }
  goto LAB_00493aef;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                uc16 separator,
                                bool parse_as_hex_float,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  DOUBLE_CONVERSION_ASSERT(*current != end);
  DOUBLE_CONVERSION_ASSERT(!parse_as_hex_float ||
      IsHexFloatString(*current, end, separator, allow_trailing_junk));

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);
  // Whether we have encountered a '.' and are parsing the decimal digits.
  // Only relevant if parse_as_hex_float is true.
  bool post_decimal = false;

  // Skip leading 0s.
  while (**current == '0') {
    if (Advance(current, separator, radix, end)) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  while (true) {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
      if (post_decimal) exponent -= radix_log_2;
    } else if (parse_as_hex_float && **current == '.') {
      post_decimal = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
      continue;
    } else if (parse_as_hex_float && (**current == 'p' || **current == 'P')) {
      break;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent += overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        if (Advance(current, separator, radix, end)) break;
        if (parse_as_hex_float && **current == '.') {
          // Just run over the '.'. We are just trying to see whether there is
          // a non-zero digit somewhere.
          Advance(current, separator, radix, end);
          DOUBLE_CONVERSION_ASSERT(*current != end);
          post_decimal = true;
        }
        if (!isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        if (!post_decimal) exponent += radix_log_2;
      }

      if (!parse_as_hex_float &&
          !allow_trailing_junk &&
          AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    if (Advance(current, separator, radix, end)) break;
  }

  DOUBLE_CONVERSION_ASSERT(number < ((int64_t)1 << kSignificandSize));
  DOUBLE_CONVERSION_ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (parse_as_hex_float) {
    DOUBLE_CONVERSION_ASSERT(**current == 'p' || **current == 'P');
    Advance(current, separator, radix, end);
    DOUBLE_CONVERSION_ASSERT(*current != end);
    bool is_negative = false;
    if (**current == '+') {
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    } else if (**current == '-') {
      is_negative = true;
      Advance(current, separator, radix, end);
      DOUBLE_CONVERSION_ASSERT(*current != end);
    }
    int written_exponent = 0;
    while (IsDecimalDigitForRadix(**current, 10)) {
      // No need to read exponents if they are too big. That could potentially overflow
      // the `written_exponent` variable.
      if (abs(written_exponent) <= 100 * Double::kMaxExponent) {
        written_exponent = 10 * written_exponent + **current - '0';
      }
      if (Advance(current, separator, radix, end)) break;
    }
    if (is_negative) written_exponent = -written_exponent;
    exponent += written_exponent;
  }

  if (exponent == 0 || number == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  DOUBLE_CONVERSION_ASSERT(number != 0);
  double result = Double(DiyFp(number, exponent)).value();
  return sign ? -result : result;
}